

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormatLite::InternalWriteMessage
                    (int field_number,MessageLite *value,int cached_size,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  uint uVar5;
  
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  uVar3 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar5 = (uint)uVar3;
      *target = (byte)uVar3 | 0x80;
      uVar3 = uVar3 >> 7;
      target = target + 1;
    } while (0x3fff < uVar5);
  }
  *target = (byte)uVar3;
  pbVar4 = target + 1;
  uVar5 = cached_size;
  if (0x7f < (uint)cached_size) {
    do {
      *pbVar4 = (byte)uVar5 | 0x80;
      cached_size = uVar5 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = cached_size;
    } while (bVar1);
  }
  *pbVar4 = (byte)cached_size;
  iVar2 = (*value->_vptr_MessageLite[5])(value,pbVar4 + 1,stream);
  return (uint8_t *)CONCAT44(extraout_var,iVar2);
}

Assistant:

uint8_t* WireFormatLite::InternalWriteMessage(int field_number,
                                              const MessageLite& value,
                                              int cached_size, uint8_t* target,
                                              io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  target = WriteTagToArray(field_number, WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(
      static_cast<uint32_t>(cached_size), target);
  return value._InternalSerialize(target, stream);
}